

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.hpp
# Opt level: O0

void __thiscall qclab::qgates::CZ<std::complex<float>_>::CZ(CZ<std::complex<float>_> *this)

{
  CZ<std::complex<float>_> *this_local;
  
  QControlledGate2<std::complex<float>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<float>_>,0,1);
  (this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_0075a128;
  std::make_unique<qclab::qgates::PauliZ<std::complex<float>>,int>((int *)&this->gate_);
  return;
}

Assistant:

CZ()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< PauliZ< T > >( 1 ) )
        { }